

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

void al_store_state(ALLEGRO_STATE *state,int flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long *plVar8;
  size_t n;
  long lVar9;
  undefined8 *puVar10;
  
  plVar8 = (long *)__tls_get_addr(&PTR_001d9500);
  puVar10 = (undefined8 *)*plVar8;
  if (puVar10 == (undefined8 *)0x0) {
    *plVar8 = (long)(plVar8 + 1);
    initialize_tls_values((thread_local_state *)(plVar8 + 1));
    puVar10 = (undefined8 *)*plVar8;
    if (puVar10 == (undefined8 *)0x0) {
      return;
    }
  }
  *(int *)(state->_tls + 0x2d0) = flags;
  if ((flags & 1U) != 0) {
    uVar1 = puVar10[1];
    *(undefined8 *)state->_tls = *puVar10;
    *(undefined8 *)(state->_tls + 8) = uVar1;
    *(undefined4 *)(state->_tls + 0x10) = *(undefined4 *)(puVar10 + 2);
    memcpy(state->_tls + 0x20,puVar10 + 4,0xb0);
    n = strlen((char *)((long)puVar10 + 0x124));
    _al_sane_strncpy(state->_tls + 0x124,(char *)((long)puVar10 + 0x124),n);
  }
  if ((flags & 2U) != 0) {
    *(undefined8 *)(state->_tls + 0x108) = puVar10[0x21];
  }
  if ((flags & 4U) != 0) {
    *(undefined8 *)(state->_tls + 0xd0) = puVar10[0x1a];
  }
  if ((flags & 8U) != 0) {
    *(undefined8 *)(state->_tls + 0xd8) = puVar10[0x1b];
  }
  if ((flags & 0x10U) != 0) {
    *(undefined8 *)(state->_tls + 0x248) = puVar10[0x20];
    uVar1 = puVar10[0x1c];
    uVar2 = puVar10[0x1d];
    uVar3 = puVar10[0x1f];
    *(undefined8 *)(state->_tls + 0x238) = puVar10[0x1e];
    *(undefined8 *)(state->_tls + 0x240) = uVar3;
    *(undefined8 *)(state->_tls + 0x228) = uVar1;
    *(undefined8 *)(state->_tls + 0x230) = uVar2;
  }
  if ((flags & 0x20U) != 0) {
    uVar1 = puVar10[0x23];
    *(undefined8 *)(state->_tls + 0x110) = puVar10[0x22];
    *(undefined8 *)(state->_tls + 0x118) = uVar1;
  }
  if ((flags & 0x40U) == 0) goto LAB_001607d2;
  lVar9 = *plVar8;
  if (lVar9 == 0) {
    *plVar8 = (long)(plVar8 + 1);
    initialize_tls_values((thread_local_state *)(plVar8 + 1));
    lVar9 = *plVar8;
    if (lVar9 != 0) goto LAB_00160780;
  }
  else {
LAB_00160780:
    lVar9 = *(long *)(lVar9 + 0xd8);
    if (lVar9 != 0) {
      uVar1 = *(undefined8 *)(lVar9 + 0x80);
      uVar2 = *(undefined8 *)(lVar9 + 0x88);
      uVar3 = *(undefined8 *)(lVar9 + 0x90);
      uVar4 = *(undefined8 *)(lVar9 + 0x98);
      uVar5 = *(undefined8 *)(lVar9 + 0xa0);
      uVar6 = *(undefined8 *)(lVar9 + 0xa8);
      uVar7 = *(undefined8 *)(lVar9 + 0xb8);
      *(undefined8 *)(state->_tls + 0x280) = *(undefined8 *)(lVar9 + 0xb0);
      *(undefined8 *)(state->_tls + 0x288) = uVar7;
      *(undefined8 *)(state->_tls + 0x270) = uVar5;
      *(undefined8 *)(state->_tls + 0x278) = uVar6;
      *(undefined8 *)(state->_tls + 0x260) = uVar3;
      *(undefined8 *)(state->_tls + 0x268) = uVar4;
      *(undefined8 *)(state->_tls + 0x250) = uVar1;
      *(undefined8 *)(state->_tls + 600) = uVar2;
      goto LAB_001607d2;
    }
  }
  al_identity_transform((ALLEGRO_TRANSFORM *)(state->_tls + 0x250));
LAB_001607d2:
  if (((uint)flags >> 8 & 1) != 0) {
    lVar9 = *plVar8;
    if (lVar9 == 0) {
      *plVar8 = (long)(plVar8 + 1);
      initialize_tls_values((thread_local_state *)(plVar8 + 1));
      lVar9 = *plVar8;
      if (lVar9 == 0) {
        return;
      }
    }
    lVar9 = *(long *)(lVar9 + 0xd8);
    if (lVar9 != 0) {
      uVar1 = *(undefined8 *)(lVar9 + 0x104);
      uVar2 = *(undefined8 *)(lVar9 + 0x10c);
      uVar3 = *(undefined8 *)(lVar9 + 0x114);
      uVar4 = *(undefined8 *)(lVar9 + 0x11c);
      uVar5 = *(undefined8 *)(lVar9 + 0x124);
      uVar6 = *(undefined8 *)(lVar9 + 300);
      uVar7 = *(undefined8 *)(lVar9 + 0x13c);
      *(undefined8 *)(state->_tls + 0x2c0) = *(undefined8 *)(lVar9 + 0x134);
      *(undefined8 *)(state->_tls + 0x2c8) = uVar7;
      *(undefined8 *)(state->_tls + 0x2b0) = uVar5;
      *(undefined8 *)(state->_tls + 0x2b8) = uVar6;
      *(undefined8 *)(state->_tls + 0x2a0) = uVar3;
      *(undefined8 *)(state->_tls + 0x2a8) = uVar4;
      *(undefined8 *)(state->_tls + 0x290) = uVar1;
      *(undefined8 *)(state->_tls + 0x298) = uVar2;
    }
  }
  return;
}

Assistant:

void al_store_state(ALLEGRO_STATE *state, int flags)
{
   thread_local_state *tls;
   INTERNAL_STATE *stored;

   if ((tls = tls_get()) == NULL)
      return;

   stored = (void *)state;
   stored->flags = flags;

#define _STORE(x) (stored->tls.x = tls->x)

   if (flags & ALLEGRO_STATE_NEW_DISPLAY_PARAMETERS) {
      _STORE(new_display_flags);
      _STORE(new_display_refresh_rate);
      _STORE(new_display_adapter);
      _STORE(new_window_x);
      _STORE(new_window_y);
      _STORE(new_display_settings);
      _al_sane_strncpy(stored->tls.new_window_title, tls->new_window_title,
                       strlen(tls->new_window_title));
   }

   if (flags & ALLEGRO_STATE_NEW_BITMAP_PARAMETERS) {
      _STORE(new_bitmap_format);
      _STORE(new_bitmap_flags);
   }

   if (flags & ALLEGRO_STATE_DISPLAY) {
      _STORE(current_display);
   }

   if (flags & ALLEGRO_STATE_TARGET_BITMAP) {
      _STORE(target_bitmap);
   }

   if (flags & ALLEGRO_STATE_BLENDER) {
      stored->stored_blender = tls->current_blender;
   }

   if (flags & ALLEGRO_STATE_NEW_FILE_INTERFACE) {
      _STORE(new_file_interface);
      _STORE(fs_interface);
   }

   if (flags & ALLEGRO_STATE_TRANSFORM) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();
      if (!target)
         al_identity_transform(&stored->stored_transform);
      else
         stored->stored_transform = target->transform;
   }

   if (flags & ALLEGRO_STATE_PROJECTION_TRANSFORM) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();
      if (target) {
         stored->stored_projection_transform = target->proj_transform;
      }
   }

#undef _STORE
}